

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall
Plan::RefreshDyndepDependents(Plan *this,DependencyScan *scan,Node *node,string *err)

{
  _Rb_tree_header *p_Var1;
  Node *initial_node;
  Edge *pEVar2;
  bool bVar3;
  pointer ppNVar4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  bool bVar8;
  pointer ppNVar9;
  vector<Node_*,_std::allocator<Node_*>_> validation_nodes;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> dependents;
  vector<Node_*,_std::allocator<Node_*>_> local_88;
  DependencyScan *local_70;
  _Rb_tree_header *local_68;
  _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  UnmarkDependents(this,node,(set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)&local_60);
  bVar8 = true;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    local_68 = &(this->want_)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_70 = scan;
    do {
      initial_node = *(Node **)(p_Var6 + 1);
      local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar3 = DependencyScan::RecomputeDirty(scan,initial_node,&local_88,err);
      bVar8 = true;
      ppNVar4 = local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppNVar9 = local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (bVar3) {
        for (; scan = local_70, ppNVar9 != ppNVar4; ppNVar9 = ppNVar9 + 1) {
          pEVar2 = (*ppNVar9)->in_edge_;
          if (((pEVar2 != (Edge *)0x0) && (pEVar2->outputs_ready_ == false)) &&
             (bVar3 = AddSubTarget(this,*ppNVar9,(Node *)0x0,err,
                                   (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0),
             ppNVar4 = local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_finish, scan = local_70, !bVar3))
          goto LAB_001096c2;
        }
        bVar8 = false;
        if (initial_node->dirty_ == true) {
          pEVar2 = initial_node->in_edge_;
          if ((pEVar2 == (Edge *)0x0) || (pEVar2->outputs_ready_ == true)) {
            __assert_fail("edge && !edge->outputs_ready()",
                          "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc"
                          ,0x19f,
                          "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                         );
          }
          p_Var7 = (this->want_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var5 = local_68;
          if (p_Var7 == (_Base_ptr)0x0) {
LAB_00109715:
            __assert_fail("want_e != want_.end()",
                          "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc"
                          ,0x1a1,
                          "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                         );
          }
          do {
            if (*(Edge **)(p_Var7 + 1) >= pEVar2) {
              p_Var5 = (_Rb_tree_header *)p_Var7;
            }
            p_Var7 = (&p_Var7->_M_left)[*(Edge **)(p_Var7 + 1) < pEVar2];
          } while (p_Var7 != (_Base_ptr)0x0);
          if ((p_Var5 == local_68) || (pEVar2 < (Edge *)p_Var5->_M_node_count)) goto LAB_00109715;
          bVar8 = false;
          if (*(int *)(p_Var5 + 1) == 0) {
            *(undefined4 *)(p_Var5 + 1) = 1;
            this->wanted_edges_ = this->wanted_edges_ + 1;
            bVar3 = Edge::is_phony(pEVar2);
            if (!bVar3) {
              this->command_edges_ = this->command_edges_ + 1;
            }
          }
        }
      }
LAB_001096c2:
      if (local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (bVar8) {
        bVar8 = false;
        goto LAB_001096fa;
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    bVar8 = true;
  }
LAB_001096fa:
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::~_Rb_tree(&local_60);
  return bVar8;
}

Assistant:

bool Plan::RefreshDyndepDependents(DependencyScan* scan, const Node* node,
                                   string* err) {
  // Collect the transitive closure of dependents and mark their edges
  // as not yet visited by RecomputeDirty.
  set<Node*> dependents;
  UnmarkDependents(node, &dependents);

  // Update the dirty state of all dependents and check if their edges
  // have become wanted.
  for (set<Node*>::iterator i = dependents.begin();
       i != dependents.end(); ++i) {
    Node* n = *i;

    // Check if this dependent node is now dirty.  Also checks for new cycles.
    std::vector<Node*> validation_nodes;
    if (!scan->RecomputeDirty(n, &validation_nodes, err))
      return false;

    // Add any validation nodes found during RecomputeDirty as new top level
    // targets.
    for (std::vector<Node*>::iterator v = validation_nodes.begin();
         v != validation_nodes.end(); ++v) {
      if (Edge* in_edge = (*v)->in_edge()) {
        if (!in_edge->outputs_ready() &&
            !AddTarget(*v, err)) {
          return false;
        }
      }
    }
    if (!n->dirty())
      continue;

    // This edge was encountered before.  However, we may not have wanted to
    // build it if the outputs were not known to be dirty.  With dyndep
    // information an output is now known to be dirty, so we want the edge.
    Edge* edge = n->in_edge();
    assert(edge && !edge->outputs_ready());
    map<Edge*, Want>::iterator want_e = want_.find(edge);
    assert(want_e != want_.end());
    if (want_e->second == kWantNothing) {
      want_e->second = kWantToStart;
      EdgeWanted(edge);
    }
  }
  return true;
}